

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::panic(VirtualMachine *this,string *message)

{
  ostream *poVar1;
  
  if (this->isPanicing == true) {
    poVar1 = std::operator<<(this->out,"RECURSIVE CALL TO PANIC, JUST EXITING!");
    std::endl<char,std::char_traits<char>>(poVar1);
    exit(1);
  }
  this->isPanicing = true;
  poVar1 = std::operator<<(this->out,"PANIC!: ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::operator<<(poVar1,"\n");
  print(this);
  exit(1);
}

Assistant:

[[noreturn]]
void runtime::VirtualMachine::panic(const std::string & message) {
  if (this->isPanicing) {
    this->out << "RECURSIVE CALL TO PANIC, JUST EXITING!" << std::endl;
    exit(1);
  }

  this->isPanicing = true;

  this->out << "PANIC!: " << message << "\n";

  this->print();

  exit(1);
}